

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

TryEmplaceResult * __thiscall
QHash<std::pair<int,int>,std::function<bool(void_const*,void*)>>::
tryEmplace_impl<std::pair<int,int>const&,std::function<bool(void_const*,void*)>const&>
          (QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *this,
          pair<int,_int> *key,function<bool_(const_void_*,_void_*)> *args)

{
  piter it;
  iterator it_00;
  bool bVar1;
  bool bVar2;
  pair<int,_int> *key_00;
  size_t bucket_00;
  long *in_RSI;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  Node *n;
  size_t bucketIndex;
  bool resized;
  bool shouldInsert;
  size_t hash;
  Bucket bucket;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> detachGuard;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *in_stack_ffffffffffffff18;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *in_stack_ffffffffffffff20;
  Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *in_stack_ffffffffffffff28;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *in_stack_ffffffffffffff30
  ;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *local_c8;
  size_t in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar3;
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
  *this_00;
  Bucket local_30;
  Bucket local_20;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (*in_RSI == 0) {
    QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::detach
              ((QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)
               in_stack_ffffffffffffff20);
  }
  local_10.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::QHash(&local_10);
  key_00 = (pair<int,_int> *)
           QHashPrivate::calculateHash<std::pair<int,int>>
                     ((pair<int,_int> *)in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18)
  ;
  local_20.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_20.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QHashPrivate::
             Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>>::
             findBucketWithHash<std::pair<int,int>>
                       (this_00,key_00,CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                       );
  bVar1 = QHashPrivate::
          Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
          ::Bucket::isUnused((Bucket *)0x3d74ff);
  bVar2 = QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::isDetached
                    ((QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)
                     in_stack_ffffffffffffff20);
  if ((!bVar2) ||
     ((bVar1 && (bVar2 = QHashPrivate::
                         Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                         ::shouldGrow((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                                       *)*in_RSI), bVar2)))) {
    QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::operator=
              (in_stack_ffffffffffffff30,
               (QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)
               in_stack_ffffffffffffff28);
    bVar2 = false;
    if (bVar1) {
      bVar2 = QHashPrivate::
              Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
              ::shouldGrow((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                            *)*in_RSI);
    }
    uVar3 = bVar2;
    bucket_00 = QHashPrivate::
                Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                ::Bucket::toBucketIndex
                          (&local_20,
                           (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                            *)*in_RSI);
    if (bVar2 == false) {
      local_c8 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 ::detached((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                             *)CONCAT17(uVar3,in_stack_ffffffffffffff48));
    }
    else {
      local_c8 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                 ::detached((Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                             *)CONCAT17(uVar3,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40);
    }
    *in_RSI = (long)local_c8;
    if (bVar2 == false) {
      QHashPrivate::
      Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>::
      Bucket::Bucket(&local_30,
                     (Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                      *)*in_RSI,bucket_00);
    }
    else {
      local_30 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>>
                 ::findBucketWithHash<std::pair<int,int>>
                           (this_00,key_00,CONCAT17(uVar3,in_stack_ffffffffffffff48));
    }
    local_20 = local_30;
  }
  if (bVar1) {
    in_stack_ffffffffffffff28 =
         QHashPrivate::
         Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
         ::Bucket::insert((Bucket *)0x3d7693);
    QHashPrivate::Node<std::pair<int,int>,std::function<bool(void_const*,void*)>>::
    createInPlace<std::function<bool(void_const*,void*)>const&>
              ((Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)
               in_stack_ffffffffffffff20,(pair<int,_int> *)in_stack_ffffffffffffff18,
               (function<bool_(const_void_*,_void_*)> *)0x3d76be);
    *(long *)(*in_RSI + 8) = *(long *)(*in_RSI + 8) + 1;
  }
  QHashPrivate::
  Data<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>::
  Bucket::toIterator((Bucket *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  it.bucket = (size_t)in_stack_ffffffffffffff28;
  it.d = in_stack_ffffffffffffff20;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::iterator::iterator
            ((iterator *)in_stack_ffffffffffffff18,it);
  it_00.i.bucket = (size_t)in_stack_ffffffffffffff28;
  it_00.i.d = in_stack_ffffffffffffff20;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::TryEmplaceResult::
  TryEmplaceResult((TryEmplaceResult *)in_stack_ffffffffffffff18,it_00,false);
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>::~QHash
            ((QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *)
             in_stack_ffffffffffffff20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (TryEmplaceResult *)in_RDI;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }